

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

string * google::protobuf::compiler::php::anon_unknown_2::ReservedNamePrefix
                   (string *__return_storage_ptr__,string *classname,FileDescriptor *file)

{
  bool bVar1;
  string *__lhs;
  allocator local_86;
  allocator local_85;
  undefined4 local_84;
  allocator local_7d;
  int local_7c;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_78;
  int i;
  char *local_60;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  undefined1 local_48 [8];
  string lower;
  bool is_reserved;
  FileDescriptor *file_local;
  string *classname_local;
  
  lower.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)local_48,(string *)classname);
  local_50._M_current = (char *)std::__cxx11::string::begin();
  local_58._M_current = (char *)std::__cxx11::string::end();
  local_60 = (char *)std::__cxx11::string::begin();
  _Stack_78 = std::
              transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
                        (local_50,local_58,
                         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )local_60,tolower);
  local_7c = 0;
  do {
    if (0x4c < local_7c) {
LAB_004c2fe9:
      if ((lower.field_2._M_local_buf[0xf] & 1U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_86);
        std::allocator<char>::~allocator((allocator<char> *)&local_86);
      }
      else {
        __lhs = FileDescriptor::package_abi_cxx11_(file);
        bVar1 = std::operator==(__lhs,"google.protobuf");
        if (bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)__return_storage_ptr__,"GPB",&local_7d);
          std::allocator<char>::~allocator((allocator<char> *)&local_7d);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)__return_storage_ptr__,"PB",&local_85);
          std::allocator<char>::~allocator((allocator<char> *)&local_85);
        }
      }
      local_84 = 1;
      std::__cxx11::string::~string((string *)local_48);
      return __return_storage_ptr__;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_48,kReservedNames[local_7c]);
    if (bVar1) {
      lower.field_2._M_local_buf[0xf] = '\x01';
      goto LAB_004c2fe9;
    }
    local_7c = local_7c + 1;
  } while( true );
}

Assistant:

std::string ReservedNamePrefix(const std::string& classname,
                                const FileDescriptor* file) {
  bool is_reserved = false;

  std::string lower = classname;
  std::transform(lower.begin(), lower.end(), lower.begin(), ::tolower);

  for (int i = 0; i < kReservedNamesSize; i++) {
    if (lower == kReservedNames[i]) {
      is_reserved = true;
      break;
    }
  }

  if (is_reserved) {
    if (file->package() == "google.protobuf") {
      return "GPB";
    } else {
      return "PB";
    }
  }

  return "";
}